

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Attribute_PDU::SetAttributeRecordSets
          (Attribute_PDU *this,
          vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
          *AR)

{
  bool bVar1;
  KUINT16 KVar2;
  size_type sVar3;
  pointer this_00;
  __normal_iterator<KDIS::DATA_TYPE::AttributeRecordSet_*,_std::vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>_>
  local_38;
  __normal_iterator<const_KDIS::DATA_TYPE::AttributeRecordSet_*,_std::vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>_>
  local_30;
  const_iterator citrEnd;
  __normal_iterator<const_KDIS::DATA_TYPE::AttributeRecordSet_*,_std::vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>_>
  local_20;
  const_iterator citr;
  vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
  *AR_local;
  Attribute_PDU *this_local;
  
  citr._M_current = (AttributeRecordSet *)AR;
  ClearAttributeRecordSet(this);
  std::
  vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
  ::operator=(&this->m_vAttributeRecordSets,
              (vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
               *)citr._M_current);
  sVar3 = std::
          vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
          ::size(&this->m_vAttributeRecordSets);
  this->m_ui16NumAttrRecSets = (KUINT16)sVar3;
  citrEnd._M_current =
       (AttributeRecordSet *)
       std::
       vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
       ::begin(&this->m_vAttributeRecordSets);
  __gnu_cxx::
  __normal_iterator<KDIS::DATA_TYPE::AttributeRecordSet_const*,std::vector<KDIS::DATA_TYPE::AttributeRecordSet,std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>>>
  ::__normal_iterator<KDIS::DATA_TYPE::AttributeRecordSet*>
            ((__normal_iterator<KDIS::DATA_TYPE::AttributeRecordSet_const*,std::vector<KDIS::DATA_TYPE::AttributeRecordSet,std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>>>
              *)&local_20,
             (__normal_iterator<KDIS::DATA_TYPE::AttributeRecordSet_*,_std::vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>_>
              *)&citrEnd);
  local_38._M_current =
       (AttributeRecordSet *)
       std::
       vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
       ::end(&this->m_vAttributeRecordSets);
  __gnu_cxx::
  __normal_iterator<KDIS::DATA_TYPE::AttributeRecordSet_const*,std::vector<KDIS::DATA_TYPE::AttributeRecordSet,std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>>>
  ::__normal_iterator<KDIS::DATA_TYPE::AttributeRecordSet*>
            ((__normal_iterator<KDIS::DATA_TYPE::AttributeRecordSet_const*,std::vector<KDIS::DATA_TYPE::AttributeRecordSet,std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>>>
              *)&local_30,&local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::DATA_TYPE::AttributeRecordSet_*,_std::vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>_>
              ::operator->(&local_20);
    KVar2 = DATA_TYPE::AttributeRecordSet::GetRecordLength(this_00);
    (this->super_Header).super_Header6.m_ui16PDULength =
         (this->super_Header).super_Header6.m_ui16PDULength + KVar2;
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::AttributeRecordSet_*,_std::vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void Attribute_PDU::SetAttributeRecordSets( const vector<AttributeRecordSet> & AR )
{
    ClearAttributeRecordSet();

    m_vAttributeRecordSets = AR;
    m_ui16NumAttrRecSets = m_vAttributeRecordSets.size();

    // Calculate the new pdu length
    vector<AttributeRecordSet>::const_iterator citr = m_vAttributeRecordSets.begin();
    vector<AttributeRecordSet>::const_iterator citrEnd = m_vAttributeRecordSets.end();
    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength += citr->GetRecordLength();
    }
}